

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

unsigned_long
assembler::anon_unknown_0::_call_external<unsigned_long>(external_function *f,registers *regs)

{
  size_type sVar1;
  undefined1 local_38 [8];
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> args;
  registers *regs_local;
  external_function *f_local;
  
  args.super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)regs;
  _get_arguments((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                  *)local_38,f);
  sVar1 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
          size((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *)
               local_38);
  switch(sVar1) {
  case 0:
    f_local = (external_function *)_call_external_0<unsigned_long>(f);
    break;
  case 1:
    f_local = (external_function *)
              _call_external_1<unsigned_long>
                        (f,(vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                            *)local_38,
                         (registers *)
                         args.
                         super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case 2:
    f_local = (external_function *)
              _call_external_2<unsigned_long>
                        (f,(vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                            *)local_38,
                         (registers *)
                         args.
                         super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case 3:
    f_local = (external_function *)
              _call_external_3<unsigned_long>
                        (f,(vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                            *)local_38,
                         (registers *)
                         args.
                         super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case 4:
    f_local = (external_function *)
              _call_external_4<unsigned_long>
                        (f,(vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                            *)local_38,
                         (registers *)
                         args.
                         super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  default:
    f_local = (external_function *)0x0;
  }
  std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::~vector
            ((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *)
             local_38);
  return (unsigned_long)f_local;
}

Assistant:

T _call_external(const external_function& f, registers& regs)
  {
      auto args = _get_arguments(f);
      switch (args.size())
      {
          case 0: return _call_external_0<T>(f);
          case 1: return _call_external_1<T>(f, args, regs);
          case 2: return _call_external_2<T>(f, args, regs);
          case 3: return _call_external_3<T>(f, args, regs);
          case 4: return _call_external_4<T>(f, args, regs);
          default: break;
      }
      return 0;
  }